

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void * xmalloc(size_t size)

{
  void *pvVar1;
  size_t __n;
  char *__s;
  
  __s = (char *)(size + (size == 0));
  pvVar1 = malloc((size_t)__s);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  xmalloc_cold_1();
  __n = strlen(__s);
  pvVar1 = xmalloc(__n + 1);
  memcpy(pvVar1,__s,__n);
  *(undefined1 *)((long)pvVar1 + __n) = 0;
  return pvVar1;
}

Assistant:

void *xmalloc(size_t size)
{
	if (size == 0) {
		size = 1;
	}
	void *result = malloc(size);
	if (result == NULL) {
		fprintf(stderr, "Out of memory - unable to allocate %lu bytes", size);
		abort();
	}
	return result;
}